

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

void DepParserTask::get_eager_action_cost(search *sch,uint32_t idx,uint64_t n)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  pvVar4 = sch->task_data;
  lVar5 = *(long *)((long)pvVar4 + 0x98);
  lVar6 = *(long *)((long)pvVar4 + 0xa0);
  if (lVar6 - lVar5 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*(uint *)(lVar6 + -4);
  }
  lVar11 = lVar6 - lVar5 >> 2;
  lVar12 = *(long *)((long)pvVar4 + 0xb8);
  lVar9 = 0;
  do {
    *(undefined4 *)(*(long *)((long)pvVar4 + 0x38) + 4 + lVar9 * 4) = 0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  uVar10 = (ulong)idx;
  if (lVar6 != lVar5 && *(long *)((long)pvVar4 + 0x98) != *(long *)((long)pvVar4 + 0xa0)) {
    lVar9 = 0;
    do {
      uVar7 = (ulong)*(uint *)(*(long *)((long)pvVar4 + 0x98) + lVar9 * 4);
      if ((*(uint32_t *)(*(long *)((long)pvVar4 + 0x58) + uVar7 * 4) == idx) &&
         (*(int *)(lVar12 + uVar7 * 4) == 9999999)) {
        piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if ((uVar10 <= n) &&
         (iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x98) + lVar9 * 4),
         *(int *)(*(long *)((long)pvVar4 + 0x58) + uVar10 * 4) == iVar2)) {
        if (iVar2 != 0) {
          piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((int)uVar8 != *(int *)(*(long *)((long)pvVar4 + 0x98) + lVar9 * 4)) {
          piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 8);
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
  }
  if (uVar10 <= n + 1) {
    lVar12 = 0;
    uVar7 = uVar10;
    do {
      if ((uVar7 <= n) && ((int)uVar8 == *(int *)(*(long *)((long)pvVar4 + 0x58) + uVar7 * 4))) {
        piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 0x10);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 0xc);
        *piVar1 = *piVar1 + 1;
      }
      bVar13 = lVar12 != 0;
      lVar12 = lVar12 + -1;
      if ((bVar13) && (uVar7 == *(uint *)(*(long *)((long)pvVar4 + 0x58) + uVar8 * 4))) {
        piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 0xc);
        *piVar1 = *piVar1 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 <= n + 1);
  }
  uVar3 = *(uint *)(*(long *)((long)pvVar4 + 0x58) + uVar10 * 4);
  if ((idx < uVar3) || ((lVar6 != lVar5 && uVar3 == 0 && (**(int **)((long)pvVar4 + 0x98) != 0)))) {
    piVar1 = (int *)(*(long *)((long)pvVar4 + 0x38) + 8);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

T* get_task_data()
  {
    return (T*)task_data;
  }